

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O3

int ndiSerialWrite(int serial_port,char *text,int n)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  
  if (n < 1) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      sVar3 = write(serial_port,text + iVar5,(ulong)(uint)n);
      iVar2 = (int)sVar3;
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        iVar2 = 0;
        if (*piVar4 != 0xb) {
          return -1;
        }
      }
      iVar5 = iVar5 + iVar2;
      uVar6 = n - iVar2;
      bVar1 = iVar2 <= n;
      n = uVar6;
    } while (uVar6 != 0 && bVar1);
  }
  return iVar5;
}

Assistant:

ndicapiExport int ndiSerialWrite(int serial_port, const char* text, int n)
{
  int i = 0;
  int m;

  while (n > 0)
  {
    if ((m = write(serial_port, &text[i], n)) == -1)
    {
      if (errno == EAGAIN)   /* system canceled us, retry */
      {
        m = 0;
      }
      else
      {
        return -1;  /* IO error occurred */
      }
    }

    n -= m;  /* n is number of chars left to write */
    i += m;  /* i is the number of chars written */
  }

  return i;  /* return the number of characters written */
}